

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

void amrex::MLLinOp::makeAgglomeratedDMap
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *ba,
               Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *dm)

{
  bool bVar1;
  Long LVar2;
  BoxArray *pmap_00;
  int *piVar3;
  int ibox;
  const_iterator __end4;
  const_iterator __begin4;
  value_type *__range4;
  int grank;
  int iproc;
  int in_stack_00000060;
  bool in_stack_00000067;
  BoxArray *in_stack_00000068;
  Vector<int,_std::allocator<int>_> pmap;
  int nprocs;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *sfc;
  int N;
  int i;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  const_reference local_80;
  int local_74;
  int local_70;
  int local_3c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_38;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_20;
  int local_18;
  int local_14;
  
  local_14 = 1;
  LVar2 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::size
                    ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x126d02f);
  local_18 = (int)LVar2;
  for (; local_14 < local_18; local_14 = local_14 + 1) {
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (size_type)in_stack_ffffffffffffff38);
    bVar1 = DistributionMapping::empty((DistributionMapping *)0x126d067);
    if (bVar1) {
      pmap_00 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                          ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (size_type)in_stack_ffffffffffffff38);
      ParallelContext::NProcsSub();
      this = &local_38;
      DistributionMapping::makeSFC(in_stack_00000068,in_stack_00000067,in_stack_00000060);
      local_20 = this;
      local_3c = ParallelContext::NProcsSub();
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (size_type)in_stack_ffffffffffffff38);
      BoxArray::size((BoxArray *)0x126d0e3);
      std::allocator<int>::allocator((allocator<int> *)0x126d0f7);
      Vector<int,_std::allocator<int>_>::vector
                ((Vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (size_type)in_stack_ffffffffffffff38,(allocator_type *)0x126d10b);
      std::allocator<int>::~allocator((allocator<int> *)0x126d117);
      for (local_70 = 0; local_70 < local_3c; local_70 = local_70 + 1) {
        local_74 = ParallelContext::local_to_global_rank(0);
        local_80 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](local_20,(long)local_70);
        local_88._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff38);
        std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff38);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                  (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_ffffffffffffff38), bVar1) {
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator*(&local_88);
          in_stack_ffffffffffffff44 = local_74;
          piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)
                              CONCAT44(local_74,in_stack_ffffffffffffff40),
                              (size_type)in_stack_ffffffffffffff38);
          *piVar3 = in_stack_ffffffffffffff44;
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&local_88);
        }
      }
      Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (size_type)in_stack_ffffffffffffff38);
      DistributionMapping::define
                ((DistributionMapping *)this,(Vector<int,_std::allocator<int>_> *)pmap_00);
      Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x126d225);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(this);
    }
  }
  return;
}

Assistant:

void
MLLinOp::makeAgglomeratedDMap (const Vector<BoxArray>& ba, Vector<DistributionMapping>& dm)
{
    BL_PROFILE("MLLinOp::makeAgglomeratedDMap");

    BL_ASSERT(!dm[0].empty());
    for (int i = 1, N=ba.size(); i < N; ++i)
    {
        if (dm[i].empty())
        {
            const std::vector< std::vector<int> >& sfc = DistributionMapping::makeSFC(ba[i]);

            const int nprocs = ParallelContext::NProcsSub();
            AMREX_ASSERT(static_cast<int>(sfc.size()) == nprocs);

            Vector<int> pmap(ba[i].size());
            for (int iproc = 0; iproc < nprocs; ++iproc) {
                int grank = ParallelContext::local_to_global_rank(iproc);
                for (int ibox : sfc[iproc]) {
                    pmap[ibox] = grank;
                }
            }
            dm[i].define(std::move(pmap));
        }
    }
}